

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O0

void __thiscall
optimization::graph_color::Graph_Color::Graph_Color(Graph_Color *this,u_int color_num,bool enable)

{
  byte in_DL;
  undefined4 in_ESI;
  MirOptimizePass *in_RDI;
  allocator<char> *unaff_retaddr;
  char *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  allocator<char> local_e;
  byte local_d;
  undefined4 local_c;
  
  local_d = in_DL & 1;
  local_c = in_ESI;
  backend::MirOptimizePass::MirOptimizePass(in_RDI);
  in_RDI->_vptr_MirOptimizePass = (_func_int **)&PTR_pass_name_abi_cxx11__0036e930;
  *(undefined4 *)&in_RDI[1]._vptr_MirOptimizePass = local_c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::allocator<char>::~allocator(&local_e);
  *(byte *)&in_RDI[6]._vptr_MirOptimizePass = local_d & 1;
  std::
  map<int,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
  ::map((map<int,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
         *)0x1a4cd8);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>_>_>
                   *)0x1a4ce5);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                   *)0x1a4cf5);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>_>_>_>
         *)0x1a4d05);
  std::
  map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::map((map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         *)0x1a4d15);
  return;
}

Assistant:

Graph_Color(u_int color_num, bool enable = true)
      : color_num(color_num), enable(enable) {}